

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int gpioCfgInternals(uint cfgWhat,uint cfgVal)

{
  FILE *pFVar1;
  uint uVar2;
  char *__format;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar1,"%s %s: cfgWhat=%u, cfgVal=%d\n",myTimeStamp::buf,"gpioCfgInternals",cfgWhat,
            cfgVal);
  }
  pFVar1 = _stderr;
  if (cfgWhat == 0x3ab249ff) {
    if (8 < cfgVal) {
      return -0x22;
    }
    gpioCfg.internals = gpioCfg.internals & 0xfffffff0 | cfgVal;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      gpioCfg.dbgLevel = cfgVal;
      return 0;
    }
    __format = "%s %s: Debug level is %u\n";
    gpioCfg.dbgLevel = cfgVal;
  }
  else {
    if (cfgWhat != 0x2186d6f1) {
      return -0x22;
    }
    uVar2 = (uint)(cfgVal != 0) << 9 | gpioCfg.internals & 0xfffffdff;
    if ((gpioCfg.internals & 0x400) != 0) {
      gpioCfg.internals = uVar2;
      return 0;
    }
    __format = "%s %s: show stats is %u\n";
    gpioCfg.internals = uVar2;
  }
  myTimeStamp();
  fprintf(pFVar1,__format,myTimeStamp::buf,"gpioCfgInternals",cfgVal);
  return 0;
}

Assistant:

int gpioCfgInternals(unsigned cfgWhat, unsigned cfgVal)
{
   int retVal = PI_BAD_CFG_INTERNAL;

   DBG(DBG_USER, "cfgWhat=%u, cfgVal=%d", cfgWhat, cfgVal);

   switch(cfgWhat)
   {
      case 562484977:

         if (cfgVal) gpioCfg.internals |= PI_CFG_STATS;
         else gpioCfg.internals &= (~PI_CFG_STATS);

         DBG(DBG_ALWAYS, "show stats is %u", cfgVal);

         retVal = 0;

         break;

      case 984762879:

         if ((cfgVal >= DBG_ALWAYS) && (cfgVal <= DBG_MAX_LEVEL))
         {
            
            gpioCfg.dbgLevel = cfgVal;
            gpioCfg.internals = (gpioCfg.internals & (~0xF)) | cfgVal;

            DBG(DBG_ALWAYS, "Debug level is %u", cfgVal);

            retVal = 0;
         }

         break;
   }

   return retVal;
}